

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# formatter.cpp
# Opt level: O0

void __thiscall
jsonnet::internal::FixIndentation::params
          (FixIndentation *this,Fodder *fodder_l,ArgParams *params,bool trailing_comma,
          Fodder *fodder_r,Indent *indent)

{
  bool bVar1;
  bool bVar2;
  size_type sVar3;
  iterator this_00;
  size_type sVar4;
  byte in_CL;
  vector<jsonnet::internal::ArgParam,_std::allocator<jsonnet::internal::ArgParam>_> *in_RDX;
  FixIndentation *in_RDI;
  reference in_R8;
  ArgParam *param;
  iterator __end2;
  iterator __begin2;
  ArgParams *__range2;
  bool first;
  Indent new_indent;
  Fodder *first_inside;
  undefined1 in_stack_000005cf;
  Indent *in_stack_000005d0;
  AST *in_stack_000005d8;
  FixIndentation *in_stack_000005e0;
  undefined8 in_stack_ffffffffffffff88;
  reference in_stack_ffffffffffffff98;
  FixIndentation *in_stack_ffffffffffffffa0;
  __normal_iterator<jsonnet::internal::ArgParam_*,_std::vector<jsonnet::internal::ArgParam,_std::allocator<jsonnet::internal::ArgParam>_>_>
  in_stack_ffffffffffffffa8;
  
  fill(in_stack_ffffffffffffffa0,&in_stack_ffffffffffffff98->idFodder,SUB81((ulong)in_RDI >> 0x38,0)
       ,SUB81((ulong)in_RDI >> 0x30,0),(uint)in_RDI,(uint)((ulong)in_stack_ffffffffffffff88 >> 0x20)
      );
  in_RDI->column = in_RDI->column + 1;
  sVar3 = std::vector<jsonnet::internal::ArgParam,_std::allocator<jsonnet::internal::ArgParam>_>::
          size(in_RDX);
  if (sVar3 != 0) {
    in_R8 = std::vector<jsonnet::internal::ArgParam,_std::allocator<jsonnet::internal::ArgParam>_>::
            operator[](in_RDX,0);
  }
  newIndent((FixIndentation *)in_stack_ffffffffffffffa8._M_current,
            (Fodder *)in_stack_ffffffffffffffa0,(Indent *)in_stack_ffffffffffffff98,
            (uint)((ulong)in_RDI >> 0x20));
  bVar1 = true;
  std::vector<jsonnet::internal::ArgParam,_std::allocator<jsonnet::internal::ArgParam>_>::begin
            ((vector<jsonnet::internal::ArgParam,_std::allocator<jsonnet::internal::ArgParam>_> *)
             in_R8);
  this_00 = std::vector<jsonnet::internal::ArgParam,_std::allocator<jsonnet::internal::ArgParam>_>::
            end((vector<jsonnet::internal::ArgParam,_std::allocator<jsonnet::internal::ArgParam>_> *
                )in_R8);
  while (bVar2 = __gnu_cxx::operator!=
                           ((__normal_iterator<jsonnet::internal::ArgParam_*,_std::vector<jsonnet::internal::ArgParam,_std::allocator<jsonnet::internal::ArgParam>_>_>
                             *)in_RDI,
                            (__normal_iterator<jsonnet::internal::ArgParam_*,_std::vector<jsonnet::internal::ArgParam,_std::allocator<jsonnet::internal::ArgParam>_>_>
                             *)in_R8), bVar2) {
    in_stack_ffffffffffffff98 =
         __gnu_cxx::
         __normal_iterator<jsonnet::internal::ArgParam_*,_std::vector<jsonnet::internal::ArgParam,_std::allocator<jsonnet::internal::ArgParam>_>_>
         ::operator*((__normal_iterator<jsonnet::internal::ArgParam_*,_std::vector<jsonnet::internal::ArgParam,_std::allocator<jsonnet::internal::ArgParam>_>_>
                      *)&stack0xffffffffffffffa8);
    if (!bVar1) {
      in_RDI->column = in_RDI->column + 1;
    }
    fill(in_RDI,&in_R8->idFodder,false,false,0x2ca6dd);
    sVar4 = std::__cxx11::
            basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>::length
                      (&in_stack_ffffffffffffff98->id->name);
    in_RDI->column = in_RDI->column + (int)sVar4;
    if (in_stack_ffffffffffffff98->expr != (AST *)0x0) {
      fill(in_RDI,&in_R8->idFodder,false,false,0x2ca724);
      in_RDI->column = in_RDI->column + 1;
      expr(in_stack_000005e0,in_stack_000005d8,in_stack_000005d0,(bool)in_stack_000005cf);
    }
    fill(in_RDI,&in_R8->idFodder,false,false,0x2ca763);
    bVar1 = false;
    __gnu_cxx::
    __normal_iterator<jsonnet::internal::ArgParam_*,_std::vector<jsonnet::internal::ArgParam,_std::allocator<jsonnet::internal::ArgParam>_>_>
    ::operator++((__normal_iterator<jsonnet::internal::ArgParam_*,_std::vector<jsonnet::internal::ArgParam,_std::allocator<jsonnet::internal::ArgParam>_>_>
                  *)&stack0xffffffffffffffa8);
  }
  if ((in_CL & 1) != 0) {
    in_RDI->column = in_RDI->column + 1;
  }
  fill((FixIndentation *)this_00._M_current,&in_stack_ffffffffffffff98->idFodder,
       SUB81((ulong)in_RDI >> 0x38,0),SUB81((ulong)in_RDI >> 0x30,0),(uint)in_RDI,
       (uint)((ulong)in_R8 >> 0x20));
  in_RDI->column = in_RDI->column + 1;
  return;
}

Assistant:

void params(Fodder &fodder_l, ArgParams &params, bool trailing_comma, Fodder &fodder_r,
                const Indent &indent)
    {
        fill(fodder_l, false, false, indent.lineUp, indent.lineUp);
        column++;  // (
        const Fodder &first_inside = params.size() == 0 ? fodder_r : params[0].idFodder;

        Indent new_indent = newIndent(first_inside, indent, column);
        bool first = true;
        for (auto &param : params) {
            if (!first)
                column++;  // ','
            fill(param.idFodder, !first, true, new_indent.lineUp);
            column += param.id->name.length();
            if (param.expr != nullptr) {
                // default arg, no spacing: x=e
                fill(param.eqFodder, false, false, new_indent.lineUp);
                column++;
                expr(param.expr, new_indent, false);
            }
            fill(param.commaFodder, false, false, new_indent.lineUp);
            first = false;
        }
        if (trailing_comma)
            column++;
        fill(fodder_r, false, false, new_indent.lineUp, indent.lineUp);
        column++;  // )
    }